

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

int __thiscall jpgd::jpeg_decoder::huff_decode(jpeg_decoder *this,huff_tables *pH,int *extra_bits)

{
  uint uVar1;
  uint uVar2;
  uint num_bits;
  int num_bits_00;
  uint local_4c;
  int bits;
  int num_extra_bits;
  int code_size;
  int ofs;
  int symbol;
  int *extra_bits_local;
  huff_tables *pH_local;
  jpeg_decoder *this_local;
  
  code_size = pH->look_up2[this->m_bit_buf >> 0x18];
  if (code_size < 0) {
    num_extra_bits = 0x17;
    do {
      code_size = pH->tree[(int)-(code_size + (this->m_bit_buf >> ((byte)num_extra_bits & 0x1f) & 1)
                                 )];
      num_extra_bits = num_extra_bits + -1;
    } while (code_size < 0);
    get_bits_no_markers(this,0x1f - num_extra_bits);
    uVar1 = get_bits_no_markers(this,code_size & 0xf);
    *extra_bits = uVar1;
  }
  else {
    uVar2 = code_size >> 8;
    if ((code_size & 0x8000U) == 0) {
      local_4c = 0;
    }
    else {
      local_4c = code_size & 0xf;
    }
    if ((uVar2 & 0x1f) != pH->code_size[(int)(code_size & 0xff)] + local_4c) {
      __assert_fail("((symbol >> 8) & 31) == pH->code_size[symbol & 255] + ((symbol & 0x8000) ? (symbol & 15) : 0)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/jpgd.cpp"
                    ,0x219,"int jpgd::jpeg_decoder::huff_decode(huff_tables *, int &)");
    }
    if ((code_size & 0x8000U) == 0) {
      num_bits = code_size & 0xf;
      num_bits_00 = (uVar2 & 0x1f) + num_bits;
      if (this->m_bits_left + 0x10 < num_bits_00) {
        get_bits_no_markers(this,uVar2 & 0x1f);
        uVar1 = get_bits_no_markers(this,num_bits);
        *extra_bits = uVar1;
      }
      else {
        uVar1 = get_bits_no_markers(this,num_bits_00);
        *extra_bits = uVar1 & (1 << (sbyte)num_bits) - 1U;
      }
    }
    else {
      get_bits_no_markers(this,uVar2 & 0x1f);
      *extra_bits = code_size >> 0x10;
    }
    code_size = code_size & 0xff;
  }
  return code_size;
}

Assistant:

inline int jpeg_decoder::huff_decode(huff_tables *pH, int& extra_bits)
{
  int symbol;

  // Check first 8-bits: do we have a complete symbol?
  if ((symbol = pH->look_up2[m_bit_buf >> 24]) < 0)
  {
    // Use a tree traversal to find symbol.
    int ofs = 23;
    do
    {
      symbol = pH->tree[-(int)(symbol + ((m_bit_buf >> ofs) & 1))];
      ofs--;
    } while (symbol < 0);

    get_bits_no_markers(8 + (23 - ofs));

    extra_bits = get_bits_no_markers(symbol & 0xF);
  }
  else
  {
    JPGD_ASSERT(((symbol >> 8) & 31) == pH->code_size[symbol & 255] + ((symbol & 0x8000) ? (symbol & 15) : 0));

    if (symbol & 0x8000)
    {
      get_bits_no_markers((symbol >> 8) & 31);
      extra_bits = symbol >> 16;
    }
    else
    {
      int code_size = (symbol >> 8) & 31;
      int num_extra_bits = symbol & 0xF;
      int bits = code_size + num_extra_bits;
      if (bits <= (m_bits_left + 16))
        extra_bits = get_bits_no_markers(bits) & ((1 << num_extra_bits) - 1);
      else
      {
        get_bits_no_markers(code_size);
        extra_bits = get_bits_no_markers(num_extra_bits);
      }
    }

    symbol &= 0xFF;
  }

  return symbol;
}